

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O2

void __thiscall
ddd::DaTrie<false,_false,_false>::swap
          (DaTrie<false,_false,_false> *this,DaTrie<false,_false,_false> *rhs)

{
  uint32_t uVar1;
  
  std::_Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>::_Vector_impl_data::_M_swap_data
            ((_Vector_impl_data *)this,(_Vector_impl_data *)rhs);
  std::_Vector_base<char,_std::allocator<char>_>::_Vector_impl_data::_M_swap_data
            ((_Vector_impl_data *)&this->tail_,(_Vector_impl_data *)&rhs->tail_);
  std::_Vector_base<ddd::Block,_std::allocator<ddd::Block>_>::_Vector_impl_data::_M_swap_data
            ((_Vector_impl_data *)&this->blocks_,(_Vector_impl_data *)&rhs->blocks_);
  std::_Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::_Vector_impl_data::_M_swap_data
            ((_Vector_impl_data *)&this->node_links_,(_Vector_impl_data *)&rhs->node_links_);
  uVar1 = this->head_pos_;
  this->head_pos_ = rhs->head_pos_;
  rhs->head_pos_ = uVar1;
  uVar1 = this->bc_emps_;
  this->bc_emps_ = rhs->bc_emps_;
  rhs->bc_emps_ = uVar1;
  uVar1 = this->tail_emps_;
  this->tail_emps_ = rhs->tail_emps_;
  rhs->tail_emps_ = uVar1;
  return;
}

Assistant:

void swap(DaTrie& rhs) {
    bc_.swap(rhs.bc_);
    tail_.swap(rhs.tail_);
    blocks_.swap(rhs.blocks_);
    node_links_.swap(rhs.node_links_);
    std::swap(head_pos_, rhs.head_pos_);
    std::swap(bc_emps_, rhs.bc_emps_);
    std::swap(tail_emps_, rhs.tail_emps_);
  }